

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

bool __thiscall gl4cts::anon_unknown_0::BasicBasic::RunIteration(BasicBasic *this,GLuint index)

{
  bool bVar1;
  int w;
  int h;
  Vector<float,_3> local_20;
  GLuint local_14;
  BasicBasic *pBStack_10;
  GLuint index_local;
  BasicBasic *this_local;
  
  local_14 = index;
  pBStack_10 = this;
  glu::CallLogWrapper::glClear
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x4000);
  glu::CallLogWrapper::glShaderStorageBlockBinding
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program,0,local_14);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,local_14,this->m_buffer);
  glu::CallLogWrapper::glDrawArraysInstancedBaseInstance
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,4,0,3,1,0);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,local_14,0);
  w = ShaderStorageBufferObjectBase::getWindowWidth(&this->super_ShaderStorageBufferObjectBase);
  h = ShaderStorageBufferObjectBase::getWindowHeight(&this->super_ShaderStorageBufferObjectBase);
  tcu::Vector<float,_3>::Vector(&local_20,0.0,1.0,0.0);
  bVar1 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                    (&this->super_ShaderStorageBufferObjectBase,0,0,w,h,&local_20);
  return bVar1;
}

Assistant:

bool RunIteration(GLuint index)
	{
		glClear(GL_COLOR_BUFFER_BIT);
		glShaderStorageBlockBinding(m_program, 0, index);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, index, m_buffer);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLES, 0, 3, 1, 0);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, index, 0);

		return ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(0, 1, 0));
	}